

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>::
find<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry_const,unsigned_long&>
          (HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks> *this,
          ArrayPtr<const_kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> table,
          unsigned_long *params)

{
  RawSchema *pRVar1;
  ulong uVar2;
  unsigned_long uVar3;
  uint *puVar4;
  ulong *in_R8;
  uint uVar5;
  ulong uVar6;
  RawSchema *pRVar7;
  uint uVar8;
  Maybe<unsigned_long> MVar9;
  Maybe<unsigned_long> MVar10;
  
  MVar9.ptr.field_1.value = table.size_;
  pRVar1 = table.ptr[1].value;
  if (pRVar1 == (RawSchema *)0x0) {
    *this = (HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>)0x0;
    MVar9.ptr._0_8_ = this;
    return (Maybe<unsigned_long>)MVar9.ptr;
  }
  uVar2 = *in_R8;
  if (uVar2 >> 0x20 == 0) {
    uVar5 = (uint)uVar2 * 0x8000 + ~(uint)uVar2;
    uVar5 = (uVar5 >> 0xc ^ uVar5) * 5;
    uVar5 = (uVar5 >> 4 ^ uVar5) * 0x809;
    uVar5 = uVar5 >> 0x10 ^ uVar5;
  }
  else {
    uVar6 = uVar2 * 0x40000 + ~uVar2;
    uVar6 = (uVar6 >> 0x1f ^ uVar6) * 0x15;
    uVar6 = (uVar6 >> 0xb ^ uVar6) * 0x41;
    uVar5 = (uint)(uVar6 >> 0x16) ^ (uint)uVar6;
  }
  uVar6 = (ulong)((int)pRVar1 - 1U & uVar5);
  uVar3 = table.ptr[1].key;
  uVar8 = *(uint *)(uVar3 + 4 + uVar6 * 8);
  if (uVar8 != 0) {
    puVar4 = (uint *)(uVar3 + uVar6 * 8);
    do {
      if (((uVar8 != 1) && (*puVar4 == uVar5)) &&
         (*(ulong *)(MVar9.ptr.field_1.value + (ulong)(uVar8 - 2) * 0x10) == uVar2)) {
        *this = (HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>)0x1;
        *(ulong *)(this + 8) = (ulong)(uVar8 - 2);
        goto LAB_0018bbda;
      }
      pRVar7 = (RawSchema *)(uVar6 + 1);
      uVar6 = (ulong)pRVar7 & 0xffffffff;
      if (pRVar7 == pRVar1) {
        uVar6 = 0;
      }
      puVar4 = (uint *)(uVar3 + uVar6 * 8);
      uVar8 = puVar4[1];
    } while (uVar8 != 0);
  }
  *this = (HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>)0x0;
LAB_0018bbda:
  MVar10.ptr.field_1.value = MVar9.ptr.field_1.value;
  MVar10.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar10.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }